

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigTempor.c
# Opt level: O0

Aig_Man_t *
Saig_ManTempor(Aig_Man_t *pAig,int nFrames,int TimeOut,int nConfLimit,int fUseBmc,int fUseTransSigs,
              int fVerbose,int fVeryVerbose)

{
  int iVar1;
  uint uVar2;
  Aig_Man_t *pAVar3;
  uint local_5c;
  uint local_4c;
  int iLastBefore;
  int iLast;
  int i;
  int Entry;
  int nFramesFinished;
  int RetValue;
  Vec_Int_t *vTransSigs;
  int local_28;
  int fUseTransSigs_local;
  int fUseBmc_local;
  int nConfLimit_local;
  int TimeOut_local;
  int nFrames_local;
  Aig_Man_t *pAig_local;
  
  _nFramesFinished = (Vec_Int_t *)0x0;
  i = -1;
  vTransSigs._4_4_ = fUseTransSigs;
  local_28 = fUseBmc;
  fUseTransSigs_local = nConfLimit;
  fUseBmc_local = TimeOut;
  nConfLimit_local = nFrames;
  _TimeOut_local = pAig;
  if (nFrames < 0) {
    __assert_fail("nFrames >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigTempor.c"
                  ,0xc0,"Aig_Man_t *Saig_ManTempor(Aig_Man_t *, int, int, int, int, int, int, int)")
    ;
  }
  if (nFrames == 0) {
    nConfLimit_local =
         Saig_ManPhasePrefixLength(pAig,fVerbose,fVeryVerbose,(Vec_Int_t **)&nFramesFinished);
    if (nConfLimit_local == 0) {
      Vec_IntFreeP((Vec_Int_t **)&nFramesFinished);
      printf("The leading sequence has length 0. Temporal decomposition is not performed.\n");
      return (Aig_Man_t *)0x0;
    }
    if (nConfLimit_local == 1) {
      Vec_IntFreeP((Vec_Int_t **)&nFramesFinished);
      printf("The leading sequence has length 1. Temporal decomposition is not performed.\n");
      return (Aig_Man_t *)0x0;
    }
    if (vTransSigs._4_4_ != 0) {
      local_4c = 0xffffffff;
      for (iLastBefore = 0; iVar1 = Vec_IntSize(_nFramesFinished), iLastBefore < iVar1;
          iLastBefore = iLastBefore + 1) {
        iVar1 = Vec_IntEntry(_nFramesFinished,iLastBefore);
        if (iVar1 == 0) {
          local_5c = local_4c;
        }
        else {
          local_5c = iLastBefore;
        }
        local_4c = local_5c;
      }
      if ((0 < (int)local_4c) && ((int)local_4c < nConfLimit_local)) {
        Abc_Print(1,"Reducing frame count from %d to %d to fit the last transient.\n",
                  (ulong)(uint)nConfLimit_local,(ulong)local_4c);
        nConfLimit_local = local_4c;
      }
    }
    Abc_Print(1,"Using computed frame number (%d).\n",(ulong)(uint)nConfLimit_local);
  }
  else {
    Abc_Print(1,"Using user-given frame number (%d).\n",(ulong)(uint)nFrames);
  }
  if (local_28 != 0) {
    Entry = Saig_BmcPerform(_TimeOut_local,0,nConfLimit_local,2000,fUseBmc_local,fUseTransSigs_local
                            ,0,fVerbose,0,&i,0,0);
    if (Entry == 0) {
      Vec_IntFreeP((Vec_Int_t **)&nFramesFinished);
      printf("A cex found in the first %d frames.\n",(ulong)(uint)nConfLimit_local);
      return (Aig_Man_t *)0x0;
    }
    if (i + 1 < nConfLimit_local) {
      uVar2 = Vec_IntLastNonZeroBeforeLimit(_nFramesFinished,i);
      if (((int)uVar2 < 1) || (vTransSigs._4_4_ == 0)) {
        Vec_IntFreeP((Vec_Int_t **)&nFramesFinished);
        printf("BMC for %d frames could not be completed. A cex may exist!\n",
               (ulong)(uint)nConfLimit_local);
        return (Aig_Man_t *)0x0;
      }
      if (i <= (int)uVar2) {
        __assert_fail("iLastBefore < nFramesFinished",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigTempor.c"
                      ,0xf2,
                      "Aig_Man_t *Saig_ManTempor(Aig_Man_t *, int, int, int, int, int, int, int)");
      }
      printf("BMC succeeded to frame %d. Adjusting frame count to be (%d) based on the last transient signal.\n"
             ,(ulong)(uint)i,(ulong)uVar2);
      nConfLimit_local = uVar2;
    }
  }
  Vec_IntFreeP((Vec_Int_t **)&nFramesFinished);
  pAVar3 = Saig_ManTemporDecompose(_TimeOut_local,nConfLimit_local);
  return pAVar3;
}

Assistant:

Aig_Man_t * Saig_ManTempor( Aig_Man_t * pAig, int nFrames, int TimeOut, int nConfLimit, int fUseBmc, int fUseTransSigs, int fVerbose, int fVeryVerbose )
{ 
    extern int Saig_ManPhasePrefixLength( Aig_Man_t * p, int fVerbose, int fVeryVerbose, Vec_Int_t ** pvTrans );

    Vec_Int_t * vTransSigs = NULL;
    int RetValue, nFramesFinished = -1;
    assert( nFrames >= 0 ); 
    if ( nFrames == 0 )
    {
        nFrames = Saig_ManPhasePrefixLength( pAig, fVerbose, fVeryVerbose, &vTransSigs );
        if ( nFrames == 0 )
        {
            Vec_IntFreeP( &vTransSigs );
            printf( "The leading sequence has length 0. Temporal decomposition is not performed.\n" );
            return NULL;
        }
        if ( nFrames == 1 )
        {
            Vec_IntFreeP( &vTransSigs );
            printf( "The leading sequence has length 1. Temporal decomposition is not performed.\n" );
            return NULL;
        }
        if ( fUseTransSigs )
        {
            int Entry, i, iLast = -1;
            Vec_IntForEachEntry( vTransSigs, Entry, i )
                iLast = Entry ? i :iLast;
            if ( iLast > 0 && iLast < nFrames )
            {
                Abc_Print( 1, "Reducing frame count from %d to %d to fit the last transient.\n", nFrames, iLast );
                nFrames = iLast;
            }
        }
        Abc_Print( 1, "Using computed frame number (%d).\n", nFrames );
    }
    else
        Abc_Print( 1, "Using user-given frame number (%d).\n", nFrames );
    // run BMC2
    if ( fUseBmc )
    {
        RetValue = Saig_BmcPerform( pAig, 0, nFrames, 2000, TimeOut, nConfLimit, 0, fVerbose, 0, &nFramesFinished, 0, 0 );
        if ( RetValue == 0 )
        {
            Vec_IntFreeP( &vTransSigs );
            printf( "A cex found in the first %d frames.\n", nFrames );
            return NULL;
        }
        if ( nFramesFinished + 1 < nFrames )
        {
            int iLastBefore = Vec_IntLastNonZeroBeforeLimit( vTransSigs, nFramesFinished );
            if ( iLastBefore < 1 || !fUseTransSigs )
            {
                Vec_IntFreeP( &vTransSigs );
                printf( "BMC for %d frames could not be completed. A cex may exist!\n", nFrames );
                return NULL;
            }
            assert( iLastBefore < nFramesFinished );
            printf( "BMC succeeded to frame %d. Adjusting frame count to be (%d) based on the last transient signal.\n", nFramesFinished, iLastBefore );
            nFrames = iLastBefore;
        }
    }
    Vec_IntFreeP( &vTransSigs );
    return Saig_ManTemporDecompose( pAig, nFrames );
}